

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineCase::LineCase
          (LineCase *this,Context *context,char *name,char *description,
          ColorlessLineData *linesBegin,ColorlessLineData *linesEnd,float lineWidth,
          WindowRectangle *viewport,int searchKernelSize)

{
  float lineWidth_local;
  ColorlessLineData *linesEnd_local;
  ColorlessLineData *linesBegin_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  LineCase *this_local;
  
  LineRenderTestCase::LineRenderTestCase
            (&this->super_LineRenderTestCase,context,name,description,linesBegin,linesEnd,lineWidth,
             viewport);
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineCase_015a9350;
  this->m_searchKernelSize = searchKernelSize;
  return;
}

Assistant:

LineCase::LineCase (Context& context, const char* name, const char* description, const LineRenderTestCase::ColorlessLineData* linesBegin, const LineRenderTestCase::ColorlessLineData* linesEnd, float lineWidth, const rr::WindowRectangle& viewport, int searchKernelSize)
	: LineRenderTestCase	(context, name, description, linesBegin, linesEnd, lineWidth, viewport)
	, m_searchKernelSize	(searchKernelSize)
{
}